

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O2

spv_target_env
Diligent::GLSLangUtils::anon_unknown_3::SpirvVersionToSpvTargetEnv(SpirvVersion Version)

{
  spv_target_env sVar1;
  string msg;
  
  if (Version < Count) {
    sVar1 = *(spv_target_env *)(&DAT_0070fb64 + (ulong)Version * 4);
  }
  else {
    FormatString<char[22]>(&msg,(char (*) [22])"Unknown SPIRV version");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SpirvVersionToSpvTargetEnv",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1a5);
    std::__cxx11::string::~string((string *)&msg);
    sVar1 = SPV_ENV_VULKAN_1_0;
  }
  return sVar1;
}

Assistant:

spv_target_env SpirvVersionToSpvTargetEnv(SpirvVersion Version)
{
    static_assert(static_cast<int>(SpirvVersion::Count) == 6, "Did you add a new member to SpirvVersion? You may need to handle it here.");
    switch (Version)
    {
        // clang-format off
        case SpirvVersion::Vk100:         return SPV_ENV_VULKAN_1_0;
        case SpirvVersion::Vk110:         return SPV_ENV_VULKAN_1_1;
        case SpirvVersion::Vk110_Spirv14: return SPV_ENV_VULKAN_1_1_SPIRV_1_4;
        case SpirvVersion::Vk120:         return SPV_ENV_VULKAN_1_2;
        case SpirvVersion::GL:            return SPV_ENV_OPENGL_4_5;
        case SpirvVersion::GLES:          return SPV_ENV_OPENGL_4_5;
        // clang-format on
        default:
            UNEXPECTED("Unknown SPIRV version");
            return SPV_ENV_VULKAN_1_0;
    }
}